

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Scroll.cxx
# Opt level: O2

void __thiscall Fl_Scroll::Fl_Scroll(Fl_Scroll *this,int X,int Y,int W,int H,char *L)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  Fl_Group::Fl_Group(&this->super_Fl_Group,X,Y,W,H,L);
  (this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget = (_func_int **)&PTR__Fl_Scroll_00279030;
  iVar1 = Fl::scrollbar_size();
  iVar2 = Fl::scrollbar_size();
  iVar3 = Fl::scrollbar_size();
  Fl_Scrollbar::Fl_Scrollbar(&this->scrollbar,(W + X) - iVar1,Y,iVar2,H - iVar3,(char *)0x0);
  iVar1 = Fl::scrollbar_size();
  iVar2 = Fl::scrollbar_size();
  iVar3 = Fl::scrollbar_size();
  Fl_Scrollbar::Fl_Scrollbar(&this->hscrollbar,X,(H + Y) - iVar1,W - iVar2,iVar3,(char *)0x0);
  (this->super_Fl_Group).super_Fl_Widget.type_ = '\x03';
  this->xposition_ = 0;
  this->yposition_ = 0;
  this->oldx = 0;
  this->oldy = 0;
  this->scrollbar_size_ = 0;
  (this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.type_ = '\x01';
  (this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.callback_ = hscrollbar_cb;
  (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.callback_ = scrollbar_cb;
  return;
}

Assistant:

Fl_Scroll::Fl_Scroll(int X,int Y,int W,int H,const char* L)
  : Fl_Group(X,Y,W,H,L),
    scrollbar(X+W-Fl::scrollbar_size(),Y,
              Fl::scrollbar_size(),H-Fl::scrollbar_size()),
    hscrollbar(X,Y+H-Fl::scrollbar_size(),
               W-Fl::scrollbar_size(),Fl::scrollbar_size()) {
  type(BOTH);
  xposition_ = oldx = 0;
  yposition_ = oldy = 0;
  scrollbar_size_ = 0;
  hscrollbar.type(FL_HORIZONTAL);
  hscrollbar.callback(hscrollbar_cb);
  scrollbar.callback(scrollbar_cb);
}